

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_compressBlock_greedy
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ZSTD_compressionParameters *cParams_00;
  ulong *puVar4;
  BYTE *pBVar5;
  ulong *puVar6;
  undefined8 *puVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  U32 *pUVar11;
  seqDef *psVar12;
  undefined8 uVar13;
  bool bVar14;
  uint uVar15;
  uint uVar16;
  BYTE *pStart;
  ulong *ilimit_w;
  uint uVar17;
  ulong *puVar18;
  int iVar19;
  U32 UVar20;
  long lVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  BYTE *pBVar25;
  ulong *puVar26;
  ulong uVar27;
  ulong uVar28;
  uint uVar29;
  uint uVar30;
  ulong uVar31;
  BYTE *litEnd;
  ulong *ip;
  ulong *puVar32;
  BYTE *pBVar33;
  ulong uVar34;
  BYTE *pInLoopLimit;
  ZSTD_compressionParameters *cParams;
  BYTE *litLimit_w;
  uint local_d4;
  ulong local_d0;
  uint local_c4;
  
  puVar4 = (ulong *)((long)src + srcSize);
  pBVar25 = (ms->window).base + (ms->window).dictLimit;
  uVar8 = rep[1];
  ip = (ulong *)((ulong)((int)src == (int)pBVar25) + (long)src);
  uVar30 = (int)ip - (int)pBVar25;
  local_d4 = uVar8;
  if (uVar30 < uVar8) {
    local_d4 = 0;
  }
  puVar6 = (ulong *)((long)src + (srcSize - 8));
  uVar9 = *rep;
  uVar34 = (ulong)uVar9;
  if (uVar30 < uVar9) {
    uVar34 = 0;
  }
  uVar29 = (uint)uVar34;
  if (ip < puVar6) {
    cParams_00 = &ms->cParams;
    puVar1 = (ulong *)((long)puVar4 - 7);
    puVar2 = (ulong *)((long)puVar4 - 3);
    puVar3 = (ulong *)((long)puVar4 - 1);
    ilimit_w = puVar4 + -4;
    do {
      uVar29 = (uint)uVar34;
      if ((uVar29 == 0) || (*(int *)(((long)ip + 1) - uVar34) != *(int *)((long)ip + 1))) {
        uVar17 = (ms->cParams).minMatch;
        iVar19 = (int)ip;
        if (uVar17 - 6 < 2) {
          uVar23 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
          pBVar33 = (ms->window).base;
          uVar24 = iVar19 - (int)pBVar33;
          uVar15 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
          uVar17 = (ms->window).lowLimit;
          uVar22 = uVar24 - uVar15;
          if (uVar24 - uVar17 <= uVar15) {
            uVar22 = uVar17;
          }
          pUVar11 = ms->chainTable;
          uVar15 = (ms->window).dictLimit;
          if (ms->loadedDictEnd != 0) {
            uVar22 = uVar17;
          }
          uVar17 = uVar24 - uVar23;
          if (uVar24 < uVar23) {
            uVar17 = 0;
          }
          uVar10 = (ms->cParams).searchLog;
          uVar16 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams_00,(BYTE *)ip,6);
          if (uVar16 <= uVar22) goto LAB_001165e6;
          iVar19 = 1 << ((byte)uVar10 & 0x1f);
          local_d0 = 999999999;
          uVar31 = 3;
          do {
            if (uVar16 < uVar15) {
LAB_00116adb:
              __assert_fail("matchIndex >= dictLimit",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x40d8,
                            "size_t ZSTD_HcFindBestMatch_generic(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                           );
            }
            puVar26 = (ulong *)(pBVar33 + uVar16);
            if (*(char *)((long)puVar26 + uVar31) == *(char *)((long)ip + uVar31)) {
              puVar32 = ip;
              if (ip < puVar1) {
                uVar28 = *ip ^ *puVar26;
                uVar27 = 0;
                if (uVar28 != 0) {
                  for (; (uVar28 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                  }
                }
                uVar27 = uVar27 >> 3 & 0x1fffffff;
                if (*puVar26 == *ip) {
                  do {
                    puVar32 = puVar32 + 1;
                    puVar26 = puVar26 + 1;
                    if (puVar1 <= puVar32) goto LAB_0011611c;
                    uVar28 = *puVar32 ^ *puVar26;
                    uVar27 = 0;
                    if (uVar28 != 0) {
                      for (; (uVar28 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                      }
                    }
                    uVar27 = (long)puVar32 + ((uVar27 >> 3 & 0x1fffffff) - (long)ip);
                  } while (*puVar26 == *puVar32);
                }
              }
              else {
LAB_0011611c:
                if ((puVar32 < puVar2) && ((int)*puVar26 == (int)*puVar32)) {
                  puVar32 = (ulong *)((long)puVar32 + 4);
                  puVar26 = (ulong *)((long)puVar26 + 4);
                }
                if ((puVar32 < puVar3) && ((short)*puVar26 == (short)*puVar32)) {
                  puVar32 = (ulong *)((long)puVar32 + 2);
                  puVar26 = (ulong *)((long)puVar26 + 2);
                }
                if (puVar32 < puVar4) {
                  puVar32 = (ulong *)((long)puVar32 + (ulong)((char)*puVar26 == (char)*puVar32));
                }
                uVar27 = (long)puVar32 - (long)ip;
              }
            }
            else {
              uVar27 = 0;
            }
            if ((uVar31 < uVar27) &&
               (local_d0 = (ulong)((uVar24 + 2) - uVar16), uVar31 = uVar27,
               (ulong *)(uVar27 + (long)ip) == puVar4)) {
              bVar14 = false;
            }
            else {
              uVar27 = uVar31;
              if (uVar17 < uVar16) {
                uVar16 = pUVar11[uVar16 & uVar23 - 1];
                bVar14 = true;
              }
              else {
                bVar14 = false;
              }
            }
          } while (((bVar14) && (uVar22 < uVar16)) &&
                  (iVar19 = iVar19 + -1, uVar31 = uVar27, iVar19 != 0));
        }
        else if (uVar17 == 5) {
          uVar23 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
          pBVar33 = (ms->window).base;
          uVar24 = iVar19 - (int)pBVar33;
          uVar15 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
          uVar17 = (ms->window).lowLimit;
          uVar22 = uVar24 - uVar15;
          if (uVar24 - uVar17 <= uVar15) {
            uVar22 = uVar17;
          }
          pUVar11 = ms->chainTable;
          uVar15 = (ms->window).dictLimit;
          if (ms->loadedDictEnd != 0) {
            uVar22 = uVar17;
          }
          uVar17 = uVar24 - uVar23;
          if (uVar24 < uVar23) {
            uVar17 = 0;
          }
          uVar10 = (ms->cParams).searchLog;
          uVar16 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams_00,(BYTE *)ip,5);
          if (uVar22 < uVar16) {
            iVar19 = 1 << ((byte)uVar10 & 0x1f);
            local_d0 = 999999999;
            uVar31 = 3;
            do {
              if (uVar16 < uVar15) goto LAB_00116adb;
              puVar26 = (ulong *)(pBVar33 + uVar16);
              if (*(char *)((long)puVar26 + uVar31) == *(char *)((long)ip + uVar31)) {
                puVar32 = ip;
                if (ip < puVar1) {
                  uVar28 = *ip ^ *puVar26;
                  uVar27 = 0;
                  if (uVar28 != 0) {
                    for (; (uVar28 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                    }
                  }
                  uVar27 = uVar27 >> 3 & 0x1fffffff;
                  if (*puVar26 == *ip) {
                    do {
                      puVar32 = puVar32 + 1;
                      puVar26 = puVar26 + 1;
                      if (puVar1 <= puVar32) goto LAB_00116308;
                      uVar28 = *puVar32 ^ *puVar26;
                      uVar27 = 0;
                      if (uVar28 != 0) {
                        for (; (uVar28 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                        }
                      }
                      uVar27 = (long)puVar32 + ((uVar27 >> 3 & 0x1fffffff) - (long)ip);
                    } while (*puVar26 == *puVar32);
                  }
                }
                else {
LAB_00116308:
                  if ((puVar32 < puVar2) && ((int)*puVar26 == (int)*puVar32)) {
                    puVar32 = (ulong *)((long)puVar32 + 4);
                    puVar26 = (ulong *)((long)puVar26 + 4);
                  }
                  if ((puVar32 < puVar3) && ((short)*puVar26 == (short)*puVar32)) {
                    puVar32 = (ulong *)((long)puVar32 + 2);
                    puVar26 = (ulong *)((long)puVar26 + 2);
                  }
                  if (puVar32 < puVar4) {
                    puVar32 = (ulong *)((long)puVar32 + (ulong)((char)*puVar26 == (char)*puVar32));
                  }
                  uVar27 = (long)puVar32 - (long)ip;
                }
              }
              else {
                uVar27 = 0;
              }
              if ((uVar31 < uVar27) &&
                 (local_d0 = (ulong)((uVar24 + 2) - uVar16), uVar31 = uVar27,
                 (ulong *)(uVar27 + (long)ip) == puVar4)) {
                bVar14 = false;
              }
              else {
                uVar27 = uVar31;
                if (uVar17 < uVar16) {
                  uVar16 = pUVar11[uVar16 & uVar23 - 1];
                  bVar14 = true;
                }
                else {
                  bVar14 = false;
                }
              }
            } while (((bVar14) && (uVar22 < uVar16)) &&
                    (iVar19 = iVar19 + -1, uVar31 = uVar27, iVar19 != 0));
          }
          else {
LAB_001165e6:
            uVar27 = 3;
            local_d0 = 999999999;
          }
        }
        else {
          uVar23 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
          pBVar33 = (ms->window).base;
          uVar24 = iVar19 - (int)pBVar33;
          uVar15 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
          uVar17 = (ms->window).lowLimit;
          uVar22 = uVar24 - uVar15;
          if (uVar24 - uVar17 <= uVar15) {
            uVar22 = uVar17;
          }
          pUVar11 = ms->chainTable;
          uVar15 = (ms->window).dictLimit;
          if (ms->loadedDictEnd != 0) {
            uVar22 = uVar17;
          }
          uVar17 = uVar24 - uVar23;
          if (uVar24 < uVar23) {
            uVar17 = 0;
          }
          uVar10 = (ms->cParams).searchLog;
          uVar16 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams_00,(BYTE *)ip,4);
          if (uVar16 <= uVar22) goto LAB_001165e6;
          iVar19 = 1 << ((byte)uVar10 & 0x1f);
          local_d0 = 999999999;
          uVar31 = 3;
          do {
            if (uVar16 < uVar15) goto LAB_00116adb;
            puVar26 = (ulong *)(pBVar33 + uVar16);
            if (*(char *)((long)puVar26 + uVar31) == *(char *)((long)ip + uVar31)) {
              puVar32 = ip;
              if (ip < puVar1) {
                uVar28 = *ip ^ *puVar26;
                uVar27 = 0;
                if (uVar28 != 0) {
                  for (; (uVar28 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                  }
                }
                uVar27 = uVar27 >> 3 & 0x1fffffff;
                if (*puVar26 == *ip) {
                  do {
                    puVar32 = puVar32 + 1;
                    puVar26 = puVar26 + 1;
                    if (puVar1 <= puVar32) goto LAB_0011654e;
                    uVar28 = *puVar32 ^ *puVar26;
                    uVar27 = 0;
                    if (uVar28 != 0) {
                      for (; (uVar28 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                      }
                    }
                    uVar27 = (long)puVar32 + ((uVar27 >> 3 & 0x1fffffff) - (long)ip);
                  } while (*puVar26 == *puVar32);
                }
              }
              else {
LAB_0011654e:
                if ((puVar32 < puVar2) && ((int)*puVar26 == (int)*puVar32)) {
                  puVar32 = (ulong *)((long)puVar32 + 4);
                  puVar26 = (ulong *)((long)puVar26 + 4);
                }
                if ((puVar32 < puVar3) && ((short)*puVar26 == (short)*puVar32)) {
                  puVar32 = (ulong *)((long)puVar32 + 2);
                  puVar26 = (ulong *)((long)puVar26 + 2);
                }
                if (puVar32 < puVar4) {
                  puVar32 = (ulong *)((long)puVar32 + (ulong)((char)*puVar26 == (char)*puVar32));
                }
                uVar27 = (long)puVar32 - (long)ip;
              }
            }
            else {
              uVar27 = 0;
            }
            if ((uVar31 < uVar27) &&
               (local_d0 = (ulong)((uVar24 + 2) - uVar16), uVar31 = uVar27,
               (ulong *)(uVar27 + (long)ip) == puVar4)) {
              bVar14 = false;
            }
            else {
              uVar27 = uVar31;
              if (uVar17 < uVar16) {
                uVar16 = pUVar11[uVar16 & uVar23 - 1];
                bVar14 = true;
              }
              else {
                bVar14 = false;
              }
            }
          } while (((bVar14) && (uVar22 < uVar16)) &&
                  (iVar19 = iVar19 + -1, uVar31 = uVar27, iVar19 != 0));
        }
        if (3 < uVar27) {
          if (local_d0 == 0) goto LAB_00116402;
          if ((src < ip) && (pBVar25 < (BYTE *)((long)ip + (2 - local_d0)))) {
            puVar26 = ip;
            while (ip = puVar26,
                  *(char *)((long)puVar26 - 1) == *(char *)((long)puVar26 + (1 - local_d0))) {
              ip = (ulong *)((long)puVar26 - 1);
              uVar27 = uVar27 + 1;
              if ((ip <= src) ||
                 (pBVar33 = (BYTE *)((long)puVar26 + (1 - local_d0)), puVar26 = ip,
                 pBVar33 <= pBVar25)) break;
            }
          }
          local_c4 = (int)local_d0 - 2;
          UVar20 = (int)local_d0 + 1;
          uVar17 = uVar29;
          goto LAB_0011668d;
        }
        ip = (ulong *)((long)ip + ((long)ip - (long)src >> 8) + 1);
      }
      else {
        puVar26 = (ulong *)((long)ip + 5);
        puVar18 = (ulong *)((long)ip + (5 - uVar34));
        puVar32 = puVar26;
        if (puVar26 < puVar1) {
          uVar27 = *puVar26 ^ *puVar18;
          uVar31 = 0;
          if (uVar27 != 0) {
            for (; (uVar27 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
            }
          }
          uVar27 = uVar31 >> 3 & 0x1fffffff;
          if (*puVar18 == *puVar26) {
            puVar32 = (ulong *)((long)ip + 0xd);
            puVar18 = (ulong *)((long)ip + (0xd - uVar34));
            do {
              if (puVar1 <= puVar32) goto LAB_001163ae;
              uVar34 = *puVar18;
              uVar31 = *puVar32;
              uVar28 = uVar31 ^ uVar34;
              uVar27 = 0;
              if (uVar28 != 0) {
                for (; (uVar28 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                }
              }
              uVar27 = (long)puVar32 + ((uVar27 >> 3 & 0x1fffffff) - (long)puVar26);
              puVar32 = puVar32 + 1;
              puVar18 = puVar18 + 1;
            } while (uVar34 == uVar31);
          }
        }
        else {
LAB_001163ae:
          if ((puVar32 < puVar2) && ((int)*puVar18 == (int)*puVar32)) {
            puVar32 = (ulong *)((long)puVar32 + 4);
            puVar18 = (ulong *)((long)puVar18 + 4);
          }
          if ((puVar32 < puVar3) && ((short)*puVar18 == (short)*puVar32)) {
            puVar32 = (ulong *)((long)puVar32 + 2);
            puVar18 = (ulong *)((long)puVar18 + 2);
          }
          if (puVar32 < puVar4) {
            puVar32 = (ulong *)((long)puVar32 + (ulong)((char)*puVar18 == (char)*puVar32));
          }
          uVar27 = (long)puVar32 - (long)puVar26;
        }
        uVar27 = uVar27 + 4;
        ip = (ulong *)((long)ip + 1);
LAB_00116402:
        UVar20 = 1;
        uVar17 = local_d4;
        local_c4 = uVar29;
LAB_0011668d:
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_00116abc:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x2038,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < seqStore->maxNbLit) {
LAB_00116a9d:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203a,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar34 = (long)ip - (long)src;
        puVar26 = (ulong *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar26 + uVar34)) {
LAB_00116a5f:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (puVar4 < ip) {
LAB_00116a7e:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203c,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (ilimit_w < ip) {
          ZSTD_safecopyLiterals((BYTE *)puVar26,(BYTE *)src,(BYTE *)ip,(BYTE *)ilimit_w);
        }
        else {
          uVar31 = *(ulong *)((long)src + 8);
          *puVar26 = *src;
          puVar26[1] = uVar31;
          if (0x10 < uVar34) {
            pBVar33 = seqStore->lit;
            puVar26 = (ulong *)(pBVar33 + 0x10);
            puVar32 = (ulong *)((long)src + 0x10);
            if (0xffffffffffffffe8 < (ulong)((long)puVar26 + (-8 - (long)puVar32))) {
              __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1268,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            if (0xffffffffffffffe0 < (ulong)((long)puVar26 + (-0x10 - (long)puVar32))) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1270,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar31 = *(ulong *)((long)src + 0x18);
            *puVar26 = *puVar32;
            *(ulong *)(pBVar33 + 0x18) = uVar31;
            if (0x20 < (long)uVar34) {
              lVar21 = 0;
              do {
                puVar7 = (undefined8 *)((long)src + lVar21 + 0x20);
                uVar13 = puVar7[1];
                pBVar5 = pBVar33 + lVar21 + 0x20;
                *(undefined8 *)pBVar5 = *puVar7;
                *(undefined8 *)(pBVar5 + 8) = uVar13;
                puVar7 = (undefined8 *)((long)src + lVar21 + 0x30);
                uVar13 = puVar7[1];
                *(undefined8 *)(pBVar5 + 0x10) = *puVar7;
                *(undefined8 *)(pBVar5 + 0x18) = uVar13;
                lVar21 = lVar21 + 0x20;
              } while (pBVar5 + 0x20 < pBVar33 + uVar34);
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar34;
        if (0xffff < uVar34) {
          if (seqStore->longLengthID != 0) {
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x204d,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthID = 1;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        psVar12 = seqStore->sequences;
        psVar12->litLength = (U16)uVar34;
        psVar12->offset = UVar20;
        if (0xffff < uVar27 - 3) {
          if (seqStore->longLengthID != 0) {
LAB_00116afa:
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x2058,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar12->matchLength = (U16)(uVar27 - 3);
        seqStore->sequences = psVar12 + 1;
        ip = (ulong *)((long)ip + uVar27);
        if ((uVar17 == 0) || (puVar6 < ip)) {
          uVar34 = (ulong)local_c4;
          src = ip;
          local_d4 = uVar17;
        }
        else {
          do {
            local_d4 = local_c4;
            uVar34 = (ulong)uVar17;
            uVar22 = uVar17;
            uVar29 = local_d4;
            if ((int)*ip != *(int *)((long)ip - uVar34)) {
LAB_001169f1:
              uVar34 = (ulong)uVar29;
              src = ip;
              local_d4 = uVar22;
              break;
            }
            puVar26 = (ulong *)((long)ip + 4);
            puVar18 = (ulong *)((long)ip + (4 - uVar34));
            puVar32 = puVar26;
            if (puVar26 < puVar1) {
              uVar27 = *puVar26 ^ *puVar18;
              uVar31 = 0;
              if (uVar27 != 0) {
                for (; (uVar27 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                }
              }
              uVar31 = uVar31 >> 3 & 0x1fffffff;
              if (*puVar18 == *puVar26) {
                puVar32 = (ulong *)((long)ip + 0xc);
                puVar18 = (ulong *)((long)ip + (0xc - uVar34));
                do {
                  if (puVar1 <= puVar32) goto LAB_001168b8;
                  uVar34 = *puVar18;
                  uVar27 = *puVar32;
                  uVar28 = uVar27 ^ uVar34;
                  uVar31 = 0;
                  if (uVar28 != 0) {
                    for (; (uVar28 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                    }
                  }
                  uVar31 = (long)puVar32 + ((uVar31 >> 3 & 0x1fffffff) - (long)puVar26);
                  puVar32 = puVar32 + 1;
                  puVar18 = puVar18 + 1;
                } while (uVar34 == uVar27);
              }
            }
            else {
LAB_001168b8:
              if ((puVar32 < puVar2) && ((int)*puVar18 == (int)*puVar32)) {
                puVar32 = (ulong *)((long)puVar32 + 4);
                puVar18 = (ulong *)((long)puVar18 + 4);
              }
              if ((puVar32 < puVar3) && ((short)*puVar18 == (short)*puVar32)) {
                puVar32 = (ulong *)((long)puVar32 + 2);
                puVar18 = (ulong *)((long)puVar18 + 2);
              }
              if (puVar32 < puVar4) {
                puVar32 = (ulong *)((long)puVar32 + (ulong)((char)*puVar18 == (char)*puVar32));
              }
              uVar31 = (long)puVar32 - (long)puVar26;
            }
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
            goto LAB_00116abc;
            if (0x20000 < seqStore->maxNbLit) goto LAB_00116a9d;
            puVar26 = (ulong *)seqStore->lit;
            if (seqStore->litStart + seqStore->maxNbLit < puVar26) goto LAB_00116a5f;
            if (puVar4 < ip) goto LAB_00116a7e;
            if (ilimit_w < ip) {
              ZSTD_safecopyLiterals((BYTE *)puVar26,(BYTE *)ip,(BYTE *)ip,(BYTE *)ilimit_w);
            }
            else {
              uVar34 = ip[1];
              *puVar26 = *ip;
              puVar26[1] = uVar34;
            }
            psVar12 = seqStore->sequences;
            psVar12->litLength = 0;
            psVar12->offset = 1;
            if (0xffff < uVar31 + 1) {
              if (seqStore->longLengthID != 0) goto LAB_00116afa;
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar12->matchLength = (U16)(uVar31 + 1);
            seqStore->sequences = psVar12 + 1;
            ip = (ulong *)((long)ip + uVar31 + 4);
            uVar22 = local_d4;
            uVar29 = uVar17;
            if (local_d4 == 0) goto LAB_001169f1;
            uVar34 = (ulong)uVar17;
            src = ip;
            local_c4 = uVar17;
            uVar17 = local_d4;
          } while (ip <= puVar6);
        }
      }
      uVar29 = (uint)uVar34;
    } while (ip < puVar6);
  }
  uVar17 = 0;
  if (uVar30 < uVar8) {
    uVar17 = uVar8;
  }
  if (uVar30 < uVar9) {
    uVar17 = uVar9;
  }
  if (uVar29 == 0) {
    uVar29 = uVar17;
  }
  if (local_d4 != 0) {
    uVar17 = local_d4;
  }
  *rep = uVar29;
  rep[1] = uVar17;
  return (long)puVar4 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_greedy(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 0, ZSTD_noDict);
}